

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O0

FractionPrecision *
icu_63::number::Precision::constructFraction
          (FractionPrecision *__return_storage_ptr__,int32_t minFrac,int32_t maxFrac)

{
  PrecisionType local_2c;
  undefined1 local_28 [8];
  PrecisionUnion union_;
  FractionSignificantSettings settings;
  int32_t maxFrac_local;
  int32_t minFrac_local;
  
  union_.increment.fMinFrac = (digits_t)minFrac;
  union_.increment.fMaxFrac = (digits_t)maxFrac;
  union_._12_2_ = 0xffff;
  union_._14_2_ = 0xffff;
  local_28._2_2_ = union_.increment.fMaxFrac;
  local_28._0_2_ = union_.increment.fMinFrac;
  local_28._4_2_ = 0xffff;
  local_28._6_2_ = -1;
  local_2c = RND_FRACTION;
  settings._0_4_ = maxFrac;
  settings._4_4_ = minFrac;
  FractionPrecision::Precision
            (__return_storage_ptr__,&local_2c,(PrecisionUnion *)local_28,UNUM_FOUND_HALFEVEN);
  return __return_storage_ptr__;
}

Assistant:

FractionPrecision Precision::constructFraction(int32_t minFrac, int32_t maxFrac) {
    FractionSignificantSettings settings;
    settings.fMinFrac = static_cast<digits_t>(minFrac);
    settings.fMaxFrac = static_cast<digits_t>(maxFrac);
    settings.fMinSig = -1;
    settings.fMaxSig = -1;
    PrecisionUnion union_;
    union_.fracSig = settings;
    return {RND_FRACTION, union_, kDefaultMode};
}